

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rudp.cpp
# Opt level: O1

ssize_t __thiscall rudp::session::send(session *this,int __fd,void *__buf,size_t __n,int __flags)

{
  byte bVar1;
  byte bVar2;
  byte bVar3;
  byte at;
  element_type *peVar4;
  ulong uVar5;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  stored_size_type sVar6;
  array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
  *paVar7;
  pointer pfVar8;
  bool bVar9;
  uint16_t uVar10;
  int iVar11;
  ssize_t sVar12;
  ssize_t extraout_RAX;
  undefined8 uVar13;
  byte bVar14;
  _Any_data *p_Var15;
  long lVar16;
  undefined4 in_register_00000034;
  buffer_ptr_t *__args;
  function<void_(bool)> *__x;
  ulong uVar17;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> cbs;
  vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_> local_88;
  pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
  local_68;
  ulong local_38;
  
  __args = (buffer_ptr_t *)CONCAT44(in_register_00000034,__fd);
  peVar4 = (__args->
           super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
           )._M_ptr;
  if (peVar4 == (element_type *)0x0) {
    local_68.first.
    super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_1_ = 0;
    if (*(long *)(__n + 0x10) == 0) {
      std::__throw_bad_function_call();
    }
    sVar12 = (**(code **)(__n + 0x18))(__n,&local_68);
  }
  else {
    if ((peVar4->
        super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
        ).m_holder.m_size == 0) goto LAB_00135ac0;
    bVar1 = (peVar4->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.
            aligner.data[0];
    local_88.
    super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_88.
    super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
    _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_88.
    super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>.
    _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    if ((bVar1 & 0x82) == 0 && (this->state != opened && (char)__buf == '\0')) {
      local_68.first.
      super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr._0_1_ = 0;
      if (*(long *)(__n + 0x10) == 0) {
        std::__throw_bad_function_call();
      }
      (**(code **)(__n + 0x18))(__n,&local_68);
    }
    else if ((this->send_head + 1 == (uint)this->acknowledge_head) ||
            ((ulong)(this->remote_config).max_out_of_standing_segs <
             this->unacknowledged_packet_count)) {
      std::
      deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>
      ::
      emplace_back<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>const&,std::function<void(bool)>const&>
                ((deque<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>,std::allocator<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,2048ul,void>>,std::function<void(bool)>>>>
                  *)&this->pending,__args,(function<void_(bool)> *)__n);
    }
    else {
      bVar2 = (peVar4->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.
              aligner.data[0];
      bVar9 = check_common_header(this,__args);
      if (!bVar9) {
        uVar13 = __cxa_allocate_exception(1);
        __cxa_throw(uVar13,&invalid_packet::typeinfo,0);
      }
      peVar4 = (__args->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      uVar5 = (peVar4->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              ).m_holder.m_size;
      if (uVar5 < 2) {
LAB_00135ac0:
        __assert_fail("this->m_holder.m_size > n","/usr/include/boost/container/vector.hpp",0x644,
                      "reference boost::container::vector<unsigned char, boost::container::dtl::static_storage_allocator<unsigned char, 2048, 0, true>>::operator[](size_type) [T = unsigned char, A = boost::container::dtl::static_storage_allocator<unsigned char, 2048, 0, true>, Options = void]"
                     );
      }
      bVar3 = *(uchar *)((long)(peVar4->
                               super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                               ).m_holder.
                               super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                               storage.aligner.data + 1);
      uVar17 = (ulong)bVar3;
      if ((uVar5 < uVar17) || (bVar3 < 4)) {
        uVar13 = __cxa_allocate_exception(1);
        __cxa_throw(uVar13,&invalid_packet::typeinfo,0);
      }
      local_38 = uVar5;
      if ((char)bVar1 < '\0') {
        paVar7 = &this->send_buffer;
        lVar16 = 0x3000;
        do {
          __x = &paVar7->_M_elems[0].second;
          if (*(long *)((long)(__x + -1) + 0x10) != 0) {
            std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::
            push_back(&local_88,__x);
          }
          this_00 = *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)((long)(__x + -1) + 0x18);
          *(undefined8 *)((long)(__x + -1) + 0x10) = 0;
          *(undefined8 *)((long)(__x + -1) + 0x18) = 0;
          if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
          }
          paVar7 = (array<std::pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>,_256UL>
                    *)(__x + 1);
          lVar16 = lVar16 + -0x30;
        } while (lVar16 != 0);
        iVar11 = rand();
        this->send_head = (uint8_t)iVar11;
        this->acknowledge_head = (uint8_t)iVar11;
        peVar4 = (__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        session_config::session_config
                  ((session_config *)&local_68,
                   (uchar *)((long)(peVar4->
                                   super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                                   ).m_holder.
                                   super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                                   storage.aligner.data + 4),
                   (uint8_t *)((long)peVar4 + (uVar17 - 2)));
        (this->self_config).connection_identifier =
             local_68.second.super__Function_base._M_functor._0_4_;
        (this->self_config).max_out_of_standing_segs =
             local_68.first.
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             ._M_ptr._0_1_;
        (this->self_config).option_flags =
             (char)local_68.first.
                   super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_ptr._1_7_;
        (this->self_config).maximum_segment_size =
             (short)((uint7)local_68.first.
                            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._1_7_ >> 8);
        (this->self_config).retransmission_timeout_value =
             (short)((uint7)local_68.first.
                            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._1_7_ >> 0x18);
        (this->self_config).cumulative_ack_timeout_value =
             (short)((uint7)local_68.first.
                            super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                            ._M_ptr._1_7_ >> 0x28);
        *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)
         &(this->self_config).null_segment_timeout_value =
             local_68.first.
             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
             ._M_refcount._M_pi;
        this->state = opened;
      }
      if ((bVar1 & 0x10) != 0) {
        this->state = closed;
      }
      at = this->send_head;
      this->send_head = at + 1;
      peVar4 = (__args->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      sVar6 = (peVar4->
              super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
              ).m_holder.m_size;
      if (sVar6 == uVar17) {
        if (sVar6 == 0) goto LAB_00135ac0;
        bVar14 = (peVar4->
                 super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage
                 .aligner.data[0] & 0xfb;
      }
      else {
        if (sVar6 == 0) goto LAB_00135ac0;
        bVar14 = (peVar4->
                 super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                 ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage
                 .aligner.data[0] | 4;
      }
      (peVar4->
      super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
      ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.aligner.
      data[0] = bVar14;
      peVar4 = (__args->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      if ((peVar4->
          super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
          ).m_holder.m_size < 3) goto LAB_00135ac0;
      *(byte *)((long)(peVar4->
                      super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                      ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                      storage.aligner.data + 2) = at;
      if ((bVar2 & 0x40) != 0) {
        peVar4 = (__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr;
        if ((peVar4->
            super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
            ).m_holder.m_size < 4) goto LAB_00135ac0;
        *(uint8_t *)
         ((long)(peVar4->
                super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage.
                aligner.data + 3) = this->receive_head + 0xff;
      }
      std::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
      ::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>,_true>
                (&local_68,__args,(function<void_(bool)> *)__n);
      std::
      pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
      ::operator=((pair<std::shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>_>,_std::function<void_(bool)>_>
                   *)((long)&(this->send_buffer)._M_elems[0].first.
                             super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                             ._M_ptr + (ulong)((uint)at * 0x30)),&local_68);
      if (local_68.second.super__Function_base._M_manager != (_Manager_type)0x0) {
        (*local_68.second.super__Function_base._M_manager)
                  ((_Any_data *)&local_68.second,(_Any_data *)&local_68.second,__destroy_functor);
      }
      if (local_68.first.
          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_68.first.
                   super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      *(undefined2 *)
       ((long)&(((__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
               super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage +
       (ulong)(bVar3 - 2)) = 0;
      peVar4 = (__args->
               super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
               )._M_ptr;
      uVar10 = checksum((uint8_t *)peVar4,
                        (peVar4->
                        super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.
                        storage.data +
                        (peVar4->
                        super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
                        ).m_holder.m_size);
      *(uint16_t *)
       ((long)&(((__args->
                 super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
                 )._M_ptr)->
               super_vector<unsigned_char,_boost::container::dtl::static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>,_void>
               ).m_holder.super_static_storage_allocator<unsigned_char,_2048UL,_0UL,_true>.storage +
       (ulong)(bVar3 - 2)) = uVar10 << 8 | uVar10 >> 8;
      send_packet(this,__args,(send_cb_t *)__n);
      this->unacknowledged_packet_count = this->unacknowledged_packet_count + 1;
      reset_cumulative_ack_counter(this);
      set_null_segment_timer(this);
      if ((bVar1 & 0x18) != 0 || local_38 != uVar17) {
        set_retransmission_timer(this,at);
      }
      pfVar8 = local_88.
               super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      if (local_88.
          super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          local_88.
          super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) {
        p_Var15 = (_Any_data *)
                  local_88.
                  super__Vector_base<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        do {
          local_68.first.
          super___shared_ptr<boost::container::static_vector<unsigned_char,_2048UL,_void>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_1_ = 0;
          if (*(long *)(p_Var15 + 1) == 0) {
            std::__throw_bad_function_call();
          }
          (**(code **)(p_Var15->_M_pod_data + 0x18))(p_Var15,(bool *)&local_68);
          p_Var15 = p_Var15 + 2;
        } while (p_Var15 != (_Any_data *)pfVar8);
      }
    }
    std::vector<std::function<void_(bool)>,_std::allocator<std::function<void_(bool)>_>_>::~vector
              (&local_88);
    sVar12 = extraout_RAX;
  }
  return sVar12;
}

Assistant:

void session::send( const buffer_ptr_t &incoming, bool resend, const send_cb_t &cb ) {
    if( !incoming ) {
      cb( false );
      return;
    }
    const bool syn = (*incoming)[ 0 ] & 0x80;
    const bool rst = (*incoming)[ 0 ] & 0x10;
    const bool nul = (*incoming)[ 0 ] & 0x08;
    const bool tcs = (*incoming)[ 0 ] & 0x02;
    std::vector< send_cb_t > cbs;
    if( !resend && state != session_state::opened && !syn && !tcs ) {
      cb( false );
      return;
    }
    if( !ready_to_send() ) {
      pending.emplace( incoming, cb );
      return;
    }
    const bool ack = (*incoming)[ 0 ] & 0x40;
    if( !check_common_header( incoming ) ) throw invalid_packet();
    const auto header_size = (*incoming)[ 1 ];
    if( header_size > incoming->size() ) throw invalid_packet();
    if( header_size < 4 ) throw invalid_packet();
    bool has_data = header_size != incoming->size();
    if( syn ) {
      std::for_each( send_buffer.begin(), send_buffer.end(), [&]( auto &v ) {
        if( v.first ) cbs.push_back( v.second );
        v.first = buffer_ptr_t();
      } );
      send_head = rand();
      acknowledge_head = send_head;
      self_config = session_config( std::next( incoming->data(), 4 ), std::next( incoming->data(), header_size - 2 ) );
      state = session_state::opened;
    }
    if( rst ) {
      state = session_state::closed;
    }
    const auto sequence_number = send_head++;
    if( header_size != incoming->size() ) (*incoming)[ 0 ] = (*incoming)[ 0 ] | 0x04;
    else (*incoming)[ 0 ] = (*incoming)[ 0 ] & 0xFB;
    (*incoming)[ 2 ] = sequence_number;
    if( ack )  (*incoming)[ 3 ] = receive_head - 1;
    send_buffer[ sequence_number ] = std::make_pair( incoming, cb );
    to_be16( std::next( incoming->data(), header_size - 2 ), 0 );
    const auto sum = rudp::checksum( incoming->data(), std::next( incoming->data(), incoming->size() ) );
    to_be16( std::next( incoming->data(), header_size - 2 ), sum );
    send_packet( incoming, cb );
    ++unacknowledged_packet_count;
    reset_cumulative_ack_counter();
    set_null_segment_timer();
    if( has_data || nul || rst ) {
      //clear_retransmission_timer( sequence_number, sequence_number + 1u );
      set_retransmission_timer( sequence_number );
    }
    for( auto &cb: cbs ) {
      cb( false );
    }
  }